

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_pubsub_attach(fio_pubsub_engine_s *engine)

{
  fio_pubsub_engine_s *engine_local;
  
  fio_lock(&fio_postoffice.engines.lock);
  fio_engine_set_insert(&fio_postoffice.engines.set,(uintptr_t)engine,engine);
  fio_unlock(&fio_postoffice.engines.lock);
  fio_pubsub_reattach(engine);
  return;
}

Assistant:

void fio_pubsub_attach(fio_pubsub_engine_s *engine) {
  fio_lock(&fio_postoffice.engines.lock);
  fio_engine_set_insert(&fio_postoffice.engines.set, (uintptr_t)engine, engine);
  fio_unlock(&fio_postoffice.engines.lock);
  fio_pubsub_reattach(engine);
}